

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void Symbol::SaveToPropIdArray
               (Symbol *sym,PropertyIdArray *propIds,ByteCodeGenerator *byteCodeGenerator,
               PropertyId *pFirstSlot)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  Type TVar4;
  undefined4 *puVar5;
  PropertyId slot;
  PropertyId *pFirstSlot_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyIdArray *propIds_local;
  Symbol *sym_local;
  
  if ((sym != (Symbol *)0x0) && (uVar1 = sym->scopeSlot, uVar1 != 0xffffffff)) {
    if (propIds->count <= uVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                         ,0x35,"((uint32)slot < propIds->count)","(uint32)slot < propIds->count");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    TVar4 = EnsurePosition(sym,byteCodeGenerator);
    (&propIds[1].count)[(int)uVar1] = TVar4;
    if (((pFirstSlot != (PropertyId *)0x0) && (bVar3 = IsArguments(sym), !bVar3)) &&
       ((*pFirstSlot == -1 || ((int)uVar1 < *pFirstSlot)))) {
      *pFirstSlot = uVar1;
    }
  }
  return;
}

Assistant:

void Symbol::SaveToPropIdArray(Symbol *sym, Js::PropertyIdArray *propIds, ByteCodeGenerator *byteCodeGenerator, Js::PropertyId *pFirstSlot /* = null */)
{
    if (sym)
    {
        Js::PropertyId slot = sym->scopeSlot;
        if (slot != Js::Constants::NoProperty)
        {
            Assert((uint32)slot < propIds->count);
            propIds->elements[slot] = sym->EnsurePosition(byteCodeGenerator);
            if (pFirstSlot && !sym->IsArguments())
            {
                if (*pFirstSlot == Js::Constants::NoProperty ||
                    *pFirstSlot > slot)
                {
                    *pFirstSlot = slot;
                }
            }
        }
    }
}